

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

tuple pybind11::make_tuple<(pybind11::return_value_policy)1>(void)

{
  PyTypeObject *pPVar1;
  bool bVar2;
  int iVar3;
  cast_error *this;
  PyObject **ppPVar4;
  object in_RDI;
  handle local_e0;
  iterator local_d8;
  value_type *arg_value_1;
  iterator __end0_1;
  iterator __begin0_1;
  array<pybind11::object,_0UL> *__range2_1;
  undefined1 local_ae;
  undefined1 local_ad;
  int counter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  iterator local_40;
  value_type *arg_value;
  iterator __end0;
  iterator __begin0;
  array<pybind11::object,_0UL> *__range2;
  undefined8 uStack_18;
  array<pybind11::object,_0UL> args;
  size_t size;
  tuple *result;
  
  uStack_18 = 0;
  __range2._7_1_ = 0;
  __begin0 = (iterator)((long)&__range2 + 7);
  __end0 = std::array<pybind11::object,_0UL>::begin((array<pybind11::object,_0UL> *)__begin0);
  arg_value = std::array<pybind11::object,_0UL>::end((array<pybind11::object,_0UL> *)__begin0);
  while( true ) {
    if (__end0 == arg_value) {
      local_ae = 0;
      tuple::tuple((tuple *)in_RDI.super_handle.m_ptr,0);
      __range2_1._4_4_ = 0;
      __begin0_1 = (iterator)((long)&__range2 + 7);
      __end0_1 = std::array<pybind11::object,_0UL>::begin
                           ((array<pybind11::object,_0UL> *)__begin0_1);
      arg_value_1 = std::array<pybind11::object,_0UL>::end
                              ((array<pybind11::object,_0UL> *)__begin0_1);
      while( true ) {
        if (__end0_1 == arg_value_1) {
          return (tuple)in_RDI.super_handle.m_ptr;
        }
        local_d8 = __end0_1;
        local_e0 = object::release(__end0_1);
        ppPVar4 = handle::ptr(&local_e0);
        pPVar1 = (PyTypeObject *)*ppPVar4;
        ppPVar4 = handle::ptr((handle *)in_RDI.super_handle.m_ptr);
        iVar3 = PyType_HasFeature((*ppPVar4)->ob_type,0x4000000);
        if (iVar3 == 0) break;
        ppPVar4 = handle::ptr((handle *)in_RDI.super_handle.m_ptr);
        (&(*ppPVar4)[1].ob_type)[__range2_1._4_4_] = pPVar1;
        __end0_1 = __end0_1 + 1;
        __range2_1._4_4_ = __range2_1._4_4_ + 1;
      }
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/pybind11/include/pybind11/cast.h"
                    ,0x4cd,
                    "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <>]"
                   );
    }
    local_40 = __end0;
    bVar2 = handle::operator_cast_to_bool(&__end0->super_handle);
    if (!bVar2) break;
    __end0 = __end0 + 1;
  }
  local_ad = 1;
  this = (cast_error *)__cxa_allocate_exception(0x10);
  type_id<std::tuple<>>();
  std::operator+(&local_80,"make_tuple(): unable to convert arguments of types \'",&local_a0);
  std::operator+(&local_60,&local_80,"\' to Python object");
  cast_error::runtime_error(this,&local_60);
  local_ad = 0;
  __cxa_throw(this,&cast_error::typeinfo,cast_error::~cast_error);
}

Assistant:

tuple make_tuple(Args&&... args_) {
    const size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (auto &arg_value : args) {
        if (!arg_value) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            throw cast_error("make_tuple(): unable to convert arguments of types '" +
                (std::string) type_id<std::tuple<Args...>>() + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}